

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

MemTxResult
memory_region_dispatch_write_mips64
          (uc_struct_conflict6 *uc,MemoryRegion *mr,hwaddr addr,uint64_t data,MemOp_conflict1 op,
          MemTxAttrs attrs)

{
  _Bool _Var1;
  uint size_00;
  uint size;
  MemOp_conflict1 op_local;
  uint64_t data_local;
  hwaddr addr_local;
  MemoryRegion *mr_local;
  uc_struct_conflict6 *uc_local;
  MemTxAttrs attrs_local;
  
  _size = data;
  data_local = addr;
  addr_local = (hwaddr)mr;
  mr_local = (MemoryRegion *)uc;
  uc_local._0_4_ = attrs;
  size_00 = memop_size(op);
  _Var1 = memory_region_access_valid_mips64
                    ((uc_struct_conflict6 *)mr_local,(MemoryRegion *)addr_local,data_local,size_00,
                     true,uc_local._0_4_);
  if (_Var1) {
    adjust_endianness((MemoryRegion *)addr_local,(uint64_t *)&size,op);
    if (*(long *)(*(long *)(addr_local + 0x10) + 8) == 0) {
      uc_local._4_4_ =
           access_with_adjusted_size
                     ((uc_struct_conflict6 *)mr_local,data_local,(uint64_t *)&size,size_00,
                      *(uint *)(*(long *)(addr_local + 0x10) + 0x40),
                      *(uint *)(*(long *)(addr_local + 0x10) + 0x44),
                      memory_region_write_with_attrs_accessor,(MemoryRegion *)addr_local,
                      uc_local._0_4_);
    }
    else {
      uc_local._4_4_ =
           access_with_adjusted_size
                     ((uc_struct_conflict6 *)mr_local,data_local,(uint64_t *)&size,size_00,
                      *(uint *)(*(long *)(addr_local + 0x10) + 0x40),
                      *(uint *)(*(long *)(addr_local + 0x10) + 0x44),memory_region_write_accessor,
                      (MemoryRegion *)addr_local,uc_local._0_4_);
    }
  }
  else {
    unassigned_mem_write((void *)addr_local,data_local,_size,size_00);
    uc_local._4_4_ = 2;
  }
  return uc_local._4_4_;
}

Assistant:

MemTxResult memory_region_dispatch_write(struct uc_struct *uc, MemoryRegion *mr,
                                         hwaddr addr,
                                         uint64_t data,
                                         MemOp op,
                                         MemTxAttrs attrs)
{
    unsigned size = memop_size(op);

    if (!memory_region_access_valid(uc, mr, addr, size, true, attrs)) {
        unassigned_mem_write(mr, addr, data, size);
        return MEMTX_DECODE_ERROR;
    }

    adjust_endianness(mr, &data, op);

    if (mr->ops->write) {
        return access_with_adjusted_size(uc, addr, &data, size,
                                         mr->ops->impl.min_access_size,
                                         mr->ops->impl.max_access_size,
                                         memory_region_write_accessor, mr,
                                         attrs);
    } else {
        return
            access_with_adjusted_size(uc, addr, &data, size,
                                      mr->ops->impl.min_access_size,
                                      mr->ops->impl.max_access_size,
                                      memory_region_write_with_attrs_accessor,
                                      mr, attrs);
    }
}